

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall
sentencepiece::ModelProto_SentencePiece::InternalSwap
          (ModelProto_SentencePiece *this,ModelProto_SentencePiece *other)

{
  bool bVar1;
  InternalMetadata *this_00;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar2;
  ArenaStringPtr *__a;
  ArenaStringPtr *__b;
  string *psVar3;
  Arena *pAVar4;
  InternalMetadata *this_01;
  ModelProto_SentencePiece *other_local;
  ModelProto_SentencePiece *this_local;
  string *local_90;
  string *other_ptr;
  string *this_ptr;
  
  google::protobuf::internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  this_01 = &(this->super_MessageLite)._internal_metadata_;
  this_00 = &(other->super_MessageLite)._internal_metadata_;
  if ((((uint)this_01->ptr_ & 1) == 1) || (((uint)this_00->ptr_ & 1) == 1)) {
    if (((uint)this_00->ptr_ & 1) == 1) {
      pCVar2 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                         (this_00);
      local_90 = &pCVar2->unknown_fields;
    }
    else {
      local_90 = google::protobuf::internal::InternalMetadata::
                 mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    google::protobuf::internal::InternalMetadata::DoSwap<std::__cxx11::string>(this_01,local_90);
  }
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  __a = &this->piece_;
  __b = &other->piece_;
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  pAVar4 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
  bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(__a,psVar3);
  if ((!bVar1) ||
     (bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(__b,psVar3), !bVar1)) {
    if (psVar3 == (string *)0x0) {
      std::swap<google::protobuf::internal::TaggedPtr<std::__cxx11::string>>
                (&__a->tagged_ptr_,&__b->tagged_ptr_);
    }
    else {
      psVar3 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(__a,pAVar4);
      google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(__b,pAVar4);
      std::__cxx11::string::swap((string *)psVar3);
    }
  }
  std::swap<float>(&this->score_,&other->score_);
  std::swap<int>(&this->type_,&other->type_);
  return;
}

Assistant:

void ModelProto_SentencePiece::InternalSwap(ModelProto_SentencePiece* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  piece_.Swap(&other->piece_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(score_, other->score_);
  swap(type_, other->type_);
}